

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O0

vector<duckdb::Value,_true> *
duckdb::TestVectorFlat::GenerateValues(TestVectorInfo *info,LogicalType *type)

{
  initializer_list<duckdb::Value> iVar1;
  initializer_list<duckdb::Value> iVar2;
  initializer_list<duckdb::Value> iVar3;
  initializer_list<duckdb::Value> iVar4;
  ulong uVar5;
  PhysicalType PVar6;
  bool bVar7;
  LogicalTypeId LVar8;
  size_type sVar9;
  reference values;
  const_iterator this;
  undefined8 uVar10;
  LogicalType *in_RDX;
  long in_RSI;
  vector<duckdb::Value,_true> *in_RDI;
  const_iterator entry;
  vector<duckdb::Value,_true> child_values_1;
  LogicalType *child_type_1;
  vector<duckdb::Value,_true> child_values_2;
  LogicalType *child_type_2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  *struct_child;
  iterator __end3_1;
  iterator __begin3_1;
  vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
  *__range3_1;
  idx_t i;
  vector<duckdb::Value,_true> child_values;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *child_type;
  const_iterator __end3;
  const_iterator __begin3;
  child_list_t<LogicalType> *__range3;
  child_list_t<LogicalType> *child_types;
  vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
  struct_children;
  vector<duckdb::Value,_true> *result;
  value_type *in_stack_fffffffffffff828;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  *in_stack_fffffffffffff830;
  allocator *paVar11;
  iterator in_stack_fffffffffffff838;
  value_type *__x;
  Value *in_stack_fffffffffffff840;
  size_type in_stack_fffffffffffff848;
  vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
  *in_stack_fffffffffffff850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff890;
  string *in_stack_fffffffffffff898;
  NotImplementedException *in_stack_fffffffffffff8a0;
  undefined8 **ppuVar12;
  undefined1 **local_758;
  undefined1 **local_718;
  LogicalType *child_type_00;
  child_list_t<Value> *in_stack_fffffffffffff938;
  vector<duckdb::Value,_true> *in_stack_fffffffffffff970;
  LogicalType *in_stack_fffffffffffff978;
  undefined1 **local_680;
  undefined1 **local_650;
  allocator local_5b9;
  string local_5b8 [32];
  _Self local_598;
  LogicalTypeId local_589;
  _Self local_588 [2];
  undefined8 *local_578;
  undefined1 *local_570 [8];
  undefined8 *local_530;
  undefined8 local_528;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 *local_460;
  undefined1 *local_458 [8];
  undefined1 local_418 [64];
  undefined8 *local_3d8;
  undefined8 local_3d0;
  LogicalType *local_358;
  undefined8 *local_348;
  undefined1 *local_340 [8];
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 *local_238;
  undefined1 *local_230 [8];
  undefined8 *local_1f0;
  undefined8 local_1e8;
  LogicalType *in_stack_fffffffffffffe38;
  __normal_iterator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_*,_std::vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>_>
  local_100;
  undefined1 *local_f8;
  ulong local_90;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_88;
  reference local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *local_68;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
  local_60;
  child_list_t<LogicalType> *local_58;
  child_list_t<LogicalType> *local_40;
  undefined1 local_38 [24];
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar13;
  
  uVar13 = 0;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x1450b1f);
  PVar6 = LogicalType::InternalType(in_RDX);
  if (PVar6 == LIST) {
    LVar8 = LogicalType::id(in_RDX);
    if (LVar8 == MAP) {
      ListType::GetChildType((LogicalType *)in_stack_fffffffffffff830);
      GenerateValues((TestVectorInfo *)in_RDX,
                     (LogicalType *)CONCAT17(uVar13,in_stack_ffffffffffffffe0));
      local_238 = local_230;
      vector<duckdb::Value,_true>::operator[]
                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff830,
                 (size_type)in_stack_fffffffffffff828);
      Value::Value(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      local_1f0 = local_230;
      local_1e8 = 1;
      ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1450fbe);
      iVar1._M_len = (size_type)in_stack_fffffffffffff840;
      iVar1._M_array = in_stack_fffffffffffff838;
      vector<duckdb::Value,_true>::vector
                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff830,iVar1,
                 (allocator_type *)in_stack_fffffffffffff828);
      Value::MAP(in_stack_fffffffffffff978,in_stack_fffffffffffff970);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)in_stack_fffffffffffff830,
                 (value_type *)in_stack_fffffffffffff828);
      Value::~Value((Value *)in_stack_fffffffffffff830);
      vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1451035);
      ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1451042);
      local_650 = (undefined1 **)&local_1f0;
      do {
        local_650 = local_650 + -8;
        Value::~Value((Value *)in_stack_fffffffffffff830);
      } while (local_650 != local_230);
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffff830,(LogicalType *)in_stack_fffffffffffff828);
      Value::Value(in_stack_fffffffffffff840,&in_stack_fffffffffffff838->type_);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)in_stack_fffffffffffff830,
                 (value_type *)in_stack_fffffffffffff828);
      Value::~Value((Value *)in_stack_fffffffffffff830);
      LogicalType::~LogicalType((LogicalType *)0x14510f3);
      local_348 = local_340;
      vector<duckdb::Value,_true>::operator[]
                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff830,
                 (size_type)in_stack_fffffffffffff828);
      Value::Value(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      local_300 = local_340;
      local_2f8 = 1;
      ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1451177);
      iVar2._M_len = (size_type)in_stack_fffffffffffff840;
      iVar2._M_array = in_stack_fffffffffffff838;
      vector<duckdb::Value,_true>::vector
                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff830,iVar2,
                 (allocator_type *)in_stack_fffffffffffff828);
      Value::MAP(in_stack_fffffffffffff978,in_stack_fffffffffffff970);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)in_stack_fffffffffffff830,
                 (value_type *)in_stack_fffffffffffff828);
      Value::~Value((Value *)in_stack_fffffffffffff830);
      vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14511ee);
      ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x14511fb);
      ppuVar12 = (undefined8 **)local_340;
      local_680 = (undefined1 **)&local_300;
      do {
        local_680 = local_680 + -8;
        Value::~Value((Value *)in_stack_fffffffffffff830);
      } while ((undefined8 **)local_680 != ppuVar12);
      vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x145125a);
    }
    else {
      local_358 = ListType::GetChildType((LogicalType *)in_stack_fffffffffffff830);
      GenerateValues((TestVectorInfo *)in_RDX,
                     (LogicalType *)CONCAT17(uVar13,in_stack_ffffffffffffffe0));
      local_460 = local_458;
      child_type_00 = local_358;
      vector<duckdb::Value,_true>::operator[]
                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff830,
                 (size_type)in_stack_fffffffffffff828);
      Value::Value(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      local_460 = (undefined8 *)local_418;
      values = vector<duckdb::Value,_true>::operator[]
                         ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff830,
                          (size_type)in_stack_fffffffffffff828);
      Value::Value(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      local_3d8 = local_458;
      local_3d0 = 2;
      ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1451651);
      iVar3._M_len = (size_type)in_stack_fffffffffffff840;
      iVar3._M_array = in_stack_fffffffffffff838;
      vector<duckdb::Value,_true>::vector
                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff830,iVar3,
                 (allocator_type *)in_stack_fffffffffffff828);
      Value::LIST(child_type_00,(vector<duckdb::Value,_true> *)values);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)in_stack_fffffffffffff830,
                 (value_type *)in_stack_fffffffffffff828);
      Value::~Value((Value *)in_stack_fffffffffffff830);
      vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14516c8);
      ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x14516d5);
      local_718 = (undefined1 **)&local_3d8;
      do {
        local_718 = local_718 + -8;
        Value::~Value((Value *)in_stack_fffffffffffff830);
      } while (local_718 != local_458);
      local_4c8 = 0;
      uStack_4c0 = 0;
      local_4b8 = 0;
      vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x1451765);
      Value::LIST(child_type_00,(vector<duckdb::Value,_true> *)values);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)in_stack_fffffffffffff830,
                 (value_type *)in_stack_fffffffffffff828);
      Value::~Value((Value *)in_stack_fffffffffffff830);
      vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14517b5);
      local_578 = local_570;
      vector<duckdb::Value,_true>::operator[]
                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff830,
                 (size_type)in_stack_fffffffffffff828);
      Value::Value(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      local_530 = local_570;
      local_528 = 1;
      ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1451839);
      iVar4._M_len = (size_type)in_stack_fffffffffffff840;
      iVar4._M_array = in_stack_fffffffffffff838;
      vector<duckdb::Value,_true>::vector
                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff830,iVar4,
                 (allocator_type *)in_stack_fffffffffffff828);
      Value::LIST(child_type_00,(vector<duckdb::Value,_true> *)values);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)in_stack_fffffffffffff830,
                 (value_type *)in_stack_fffffffffffff828);
      Value::~Value((Value *)in_stack_fffffffffffff830);
      vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14518b0);
      ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x14518bd);
      ppuVar12 = (undefined8 **)local_570;
      local_758 = (undefined1 **)&local_530;
      do {
        local_758 = local_758 + -8;
        Value::~Value((Value *)in_stack_fffffffffffff830);
      } while ((undefined8 **)local_758 != ppuVar12);
      vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1451910);
    }
  }
  else if (PVar6 == STRUCT) {
    vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
    ::vector((vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
              *)0x1450b5d);
    local_40 = StructType::GetChildTypes_abi_cxx11_((LogicalType *)in_stack_fffffffffffff830);
    ::std::
    vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
    ::resize(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    local_58 = local_40;
    local_60._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
          *)::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)in_stack_fffffffffffff828);
    local_68 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                *)::std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         *)in_stack_fffffffffffff828);
    while (bVar7 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                               *)in_stack_fffffffffffff830,
                              (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                               *)in_stack_fffffffffffff828), bVar7) {
      local_70 = __gnu_cxx::
                 __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                 ::operator*(&local_60);
      GenerateValues((TestVectorInfo *)in_RDX,
                     (LogicalType *)CONCAT17(uVar13,in_stack_ffffffffffffffe0));
      for (local_90 = 0; uVar5 = local_90,
          sVar9 = ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::size(&local_88),
          uVar5 < sVar9; local_90 = local_90 + 1) {
        vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
        ::operator[]((vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
                      *)in_stack_fffffffffffff830,(size_type)in_stack_fffffffffffff828);
        vector<duckdb::Value,_true>::operator[]
                  ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff830,
                   (size_type)in_stack_fffffffffffff828);
        ::std::make_pair<std::__cxx11::string_const&,duckdb::Value>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff838,(Value *)in_stack_fffffffffffff830);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                     *)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
        ::~pair(in_stack_fffffffffffff830);
      }
      vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1450d6e);
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
      ::operator++(&local_60);
    }
    local_f8 = local_38;
    local_100._M_current =
         (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
          *)::std::
            vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
            ::begin((vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
                     *)in_stack_fffffffffffff828);
    ::std::
    vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
    ::end((vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
           *)in_stack_fffffffffffff828);
    while (bVar7 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_*,_std::vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>_>
                               *)in_stack_fffffffffffff830,
                              (__normal_iterator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_*,_std::vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>_>
                               *)in_stack_fffffffffffff828), bVar7) {
      __gnu_cxx::
      __normal_iterator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_*,_std::vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>_>
      ::operator*(&local_100);
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                *)in_stack_fffffffffffff830,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                *)in_stack_fffffffffffff828);
      Value::STRUCT(in_stack_fffffffffffff938);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)in_stack_fffffffffffff830,
                 (value_type *)in_stack_fffffffffffff828);
      Value::~Value((Value *)in_stack_fffffffffffff830);
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                 *)0x1450e64);
      __gnu_cxx::
      __normal_iterator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_*,_std::vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>_>
      ::operator++(&local_100);
    }
    vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
    ::~vector((vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
               *)0x1450ec9);
  }
  else {
    __x = *(value_type **)(in_RSI + 8);
    local_589 = LogicalType::id(in_RDX);
    this = ::std::
           map<duckdb::LogicalTypeId,_duckdb::TestType,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
           ::find((map<duckdb::LogicalTypeId,_duckdb::TestType,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
                   *)in_stack_fffffffffffff828,(key_type *)0x1451bb2);
    local_588[0]._M_node = this._M_node;
    local_598._M_node =
         (_Base_ptr)
         ::std::
         map<duckdb::LogicalTypeId,_duckdb::TestType,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
         ::end((map<duckdb::LogicalTypeId,_duckdb::TestType,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>_>
                *)in_stack_fffffffffffff828);
    bVar7 = ::std::operator==(local_588,&local_598);
    if (bVar7) {
      uVar10 = __cxa_allocate_exception(0x10);
      paVar11 = &local_5b9;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_5b8,"Unimplemented type for test_vector_types %s",paVar11);
      LogicalType::ToString_abi_cxx11_(in_stack_fffffffffffffe38);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890);
      __cxa_throw(uVar10,&NotImplementedException::typeinfo,
                  NotImplementedException::~NotImplementedException);
    }
    ::std::_Rb_tree_const_iterator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>::
    operator->((_Rb_tree_const_iterator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_> *
               )0x1451d24);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)this._M_node,__x);
    ::std::_Rb_tree_const_iterator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_>::
    operator->((_Rb_tree_const_iterator<std::pair<const_duckdb::LogicalTypeId,_duckdb::TestType>_> *
               )0x1451d47);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)this._M_node,__x);
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
    emplace_back<duckdb::LogicalType_const&>
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)this._M_node,&__x->type_);
  }
  return in_RDI;
}

Assistant:

static vector<Value> GenerateValues(TestVectorInfo &info, const LogicalType &type) {
		vector<Value> result;
		switch (type.InternalType()) {
		case PhysicalType::STRUCT: {
			vector<child_list_t<Value>> struct_children;
			auto &child_types = StructType::GetChildTypes(type);

			struct_children.resize(TEST_VECTOR_CARDINALITY);
			for (auto &child_type : child_types) {
				auto child_values = GenerateValues(info, child_type.second);

				for (idx_t i = 0; i < child_values.size(); i++) {
					struct_children[i].push_back(make_pair(child_type.first, std::move(child_values[i])));
				}
			}
			for (auto &struct_child : struct_children) {
				result.push_back(Value::STRUCT(std::move(struct_child)));
			}
			break;
		}
		case PhysicalType::LIST: {
			if (type.id() == LogicalTypeId::MAP) {
				auto &child_type = ListType::GetChildType(type);
				auto child_values = GenerateValues(info, child_type);
				result.push_back(Value::MAP(child_type, {child_values[0]}));
				result.push_back(Value(type));
				result.push_back(Value::MAP(child_type, {child_values[1]}));
				break;
			}
			auto &child_type = ListType::GetChildType(type);
			auto child_values = GenerateValues(info, child_type);

			result.push_back(Value::LIST(child_type, {child_values[0], child_values[1]}));
			result.push_back(Value::LIST(child_type, {}));
			result.push_back(Value::LIST(child_type, {child_values[2]}));
			break;
		}
		default: {
			auto entry = info.test_type_map.find(type.id());
			if (entry == info.test_type_map.end()) {
				throw NotImplementedException("Unimplemented type for test_vector_types %s", type.ToString());
			}
			result.push_back(entry->second.min_value);
			result.push_back(entry->second.max_value);
			result.emplace_back(type);
			break;
		}
		}
		return result;
	}